

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O0

int nva_wr(nva_regspace *regspace,uint32_t addr,uint64_t val)

{
  int iVar1;
  uint32_t val_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  uint32_t savecfg;
  uint32_t savepos;
  uint32_t vstbase;
  uint8_t idx_1;
  int iStack_48;
  uint8_t idx;
  uint32_t vgabase;
  uint32_t vgaio;
  int i;
  void *raw;
  size_t rawlen;
  void *rawbase;
  uint64_t val_local;
  uint32_t addr_local;
  nva_regspace *regspace_local;
  
  uVar3 = (uint32_t)val;
  switch(regspace->type) {
  case NVA_REGSPACE_BAR0:
    rawlen = (size_t)regspace->card->bar0;
    raw = (void *)regspace->card->bar0len;
    goto LAB_00103593;
  case NVA_REGSPACE_BAR1:
    rawlen = (size_t)regspace->card->bar1;
    raw = (void *)regspace->card->bar1len;
    if (regspace->card->hasbar1 == 0) {
      return 3;
    }
    goto LAB_00103593;
  case NVA_REGSPACE_BAR2:
    rawlen = (size_t)regspace->card->bar2;
    raw = (void *)regspace->card->bar2len;
    if (regspace->card->hasbar2 == 0) {
      return 3;
    }
    goto LAB_00103593;
  case NVA_REGSPACE_IOBAR:
    if (regspace->card->iobar == (pci_io_handle *)0x0) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->card->iobarlen - (long)regspace->regsz < (ulong)addr) {
      regspace_local._4_4_ = 1;
    }
    else {
      iVar1 = regspace->regsz;
      if (iVar1 == 1) {
        pci_io_write8(regspace->card->iobar,addr,val & 0xff);
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 2) {
        pci_io_write16(regspace->card->iobar,addr,val & 0xffff);
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 4) {
        pci_io_write32(regspace->card->iobar,addr,val & 0xffffffff);
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    break;
  case NVA_REGSPACE_RAWMEM:
    rawlen = (size_t)regspace->card->rawmem;
    raw = &Elf64_Ehdr_00100000;
LAB_00103593:
    if (rawlen == 0) {
      regspace_local._4_4_ = 4;
    }
    else if ((ulong)((long)raw - (long)regspace->regsz) < (ulong)addr) {
      regspace_local._4_4_ = 1;
    }
    else {
      puVar4 = (uint64_t *)(rawlen + addr);
      switch(regspace->regsz) {
      case 1:
        *(char *)puVar4 = (char)val;
        regspace_local._4_4_ = 0;
        break;
      case 2:
        *(short *)puVar4 = (short)val;
        regspace_local._4_4_ = 0;
        break;
      default:
        regspace_local._4_4_ = 2;
        break;
      case 4:
        *(uint32_t *)puVar4 = uVar3;
        regspace_local._4_4_ = 0;
        break;
      case 8:
        *puVar4 = val;
        regspace_local._4_4_ = 0;
      }
    }
    break;
  case NVA_REGSPACE_RAWIO:
    if (regspace->card->rawio == (pci_io_handle *)0x0) {
      regspace_local._4_4_ = 3;
    }
    else if (0x10000U - regspace->regsz < addr) {
      regspace_local._4_4_ = 1;
    }
    else {
      iVar1 = regspace->regsz;
      if (iVar1 == 1) {
        pci_io_write8(regspace->card->rawio,addr,val & 0xff);
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 2) {
        pci_io_write16(regspace->card->rawio,addr,val & 0xffff);
        regspace_local._4_4_ = 0;
      }
      else if (iVar1 == 4) {
        pci_io_write32(regspace->card->rawio,addr,val & 0xffffffff);
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    break;
  case NVA_REGSPACE_PDAC:
    if ((regspace->card->chipset).chipset == 1) {
      if (0x10000U - regspace->regsz < addr) {
        regspace_local._4_4_ = 1;
      }
      else if (regspace->regsz < 9) {
        nva_wr32(regspace->cnum,0x609010,addr & 0xff);
        nva_wr32(regspace->cnum,0x609014,addr >> 8);
        for (vgabase = 0; (int)vgabase < regspace->regsz; vgabase = vgabase + 1) {
          nva_wr32(regspace->cnum,0x609018,(uint)(val >> ((byte)(vgabase << 3) & 0x3f)) & 0xff);
        }
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_EEPROM:
    if ((regspace->card->chipset).chipset == 1) {
      if (regspace->regsz == 1) {
        if (addr < 0x80) {
          do {
            uVar2 = nva_rd32(regspace->cnum,0x60a400);
          } while ((uVar2 & 0x10000000) != 0);
          nva_wr32(regspace->cnum,0x60a400,addr << 8 | 0x1000000 | uVar3 & 0xff);
          do {
            uVar3 = nva_rd32(regspace->cnum,0x60a400);
          } while ((uVar3 & 0x10000000) != 0);
          regspace_local._4_4_ = 0;
        }
        else {
          regspace_local._4_4_ = 1;
        }
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_VGA_CR:
    iStack_48 = 0x3d4;
    if (0xff < addr) {
      return 1;
    }
    goto LAB_00103a33;
  case NVA_REGSPACE_VGA_SR:
    iStack_48 = 0x3c4;
    if (7 < addr) {
      return 1;
    }
    goto LAB_00103a33;
  case NVA_REGSPACE_VGA_AR:
    iStack_48 = 0x3c0;
    if (0x1f < addr) {
      return 1;
    }
    goto LAB_00103a33;
  case NVA_REGSPACE_VGA_GR:
    iStack_48 = 0x3ce;
    if (0xf < addr) {
      return 1;
    }
LAB_00103a33:
    if (regspace->regsz == 1) {
      if ((regspace->card->chipset).card_type == 1) {
        vstbase = 0x6d0000;
        if (regspace->idx != 0) {
          return 3;
        }
      }
      else if ((regspace->card->chipset).card_type < 0x50) {
        if ((iStack_48 == 0x3c4) || (iStack_48 == 0x3ce)) {
          vstbase = 0xc0000;
        }
        else {
          vstbase = 0x601000;
        }
        if (2 < regspace->idx) {
          return 3;
        }
        if (((((regspace->card->chipset).chipset < 0x17) ||
             ((regspace->card->chipset).chipset == 0x1a)) ||
            ((regspace->card->chipset).chipset == 0x20)) && (regspace->idx == 1)) {
          return 3;
        }
        vstbase = regspace->idx * 0x2000 + vstbase;
      }
      else {
        vstbase = 0x601000;
        if (regspace->idx != 0) {
          return 3;
        }
      }
      if (iStack_48 == 0x3c0) {
        nva_rd8(regspace->cnum,vstbase + 0x3da);
        uVar2 = nva_rd8(regspace->cnum,vstbase + 0x3c0);
        nva_rd8(regspace->cnum,vstbase + 0x3da);
        nva_wr8(regspace->cnum,vstbase + 0x3c0,addr);
        nva_wr8(regspace->cnum,vstbase + 0x3c0,uVar3);
        nva_wr8(regspace->cnum,vstbase + 0x3c0,uVar2 & 0xff);
      }
      else {
        uVar2 = nva_rd8(regspace->cnum,vstbase + iStack_48);
        nva_wr8(regspace->cnum,vstbase + iStack_48,addr);
        nva_wr8(regspace->cnum,vstbase + iStack_48 + 1,uVar3);
        nva_wr8(regspace->cnum,vstbase + iStack_48,uVar2 & 0xff);
      }
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_VGA_ST:
    if ((regspace->card->chipset).chipset < 0x41) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 1) {
      savecfg = 0x1380;
      if (0x4f < (regspace->card->chipset).card_type) {
        savecfg = 0x619e40;
      }
      uVar2 = nva_rd32(regspace->cnum,savecfg + 0xc);
      val_00 = nva_rd32(regspace->cnum,savecfg + 8);
      nva_wr32(regspace->cnum,savecfg + 0xc,addr);
      nva_wr32(regspace->cnum,savecfg + 8,7);
      nva_wr32(regspace->cnum,savecfg,uVar3);
      nva_wr32(regspace->cnum,savecfg + 8,val_00);
      nva_wr32(regspace->cnum,savecfg + 0xc,uVar2);
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_DPRAM:
    if ((regspace->card->chipset).chipset == 0x34) {
      if (regspace->regsz == 4) {
        nva_wr32(regspace->cnum,0x400bb0,addr);
        nva_wr32(regspace->cnum,0x400bb4,uVar3);
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else if (((regspace->card->chipset).card_type < 4) ||
            (0x1f < (regspace->card->chipset).card_type)) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x400828,addr);
      nva_wr32(regspace->cnum,0x40082c,uVar3);
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_PIPE:
    if (((regspace->card->chipset).card_type < 0x10) || (0x4f < (regspace->card->chipset).card_type)
       ) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x400f50,addr);
      nva_wr32(regspace->cnum,0x400f54,uVar3);
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_RDI:
    if ((((regspace->card->chipset).chipset == 0x17) || ((regspace->card->chipset).chipset == 0x18))
       || ((regspace->card->chipset).chipset == 0x1f)) {
      if (regspace->regsz == 4) {
        nva_wr32(regspace->cnum,0x400a08,addr);
        nva_wr32(regspace->cnum,0x400a0c,uVar3);
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else if (((regspace->card->chipset).card_type < 0x20) ||
            (0x4f < (regspace->card->chipset).card_type)) {
      regspace_local._4_4_ = 3;
    }
    else {
      nva_wr32(regspace->cnum,0x400750,addr);
      nva_wr32(regspace->cnum,0x400754,uVar3);
      regspace_local._4_4_ = 0;
    }
    break;
  case NVA_REGSPACE_RDIB:
    if (((regspace->card->chipset).card_type < 0x20) || (0x4f < (regspace->card->chipset).card_type)
       ) {
      regspace_local._4_4_ = 3;
    }
    else {
      nva_wr32(regspace->cnum,0x400750,addr);
      nva_wr32(regspace->cnum,0x400758,uVar3);
      regspace_local._4_4_ = 0;
    }
    break;
  case NVA_REGSPACE_VCOMP_CODE:
    if ((regspace->card->chipset).chipset == 0xaf) {
      if (regspace->regsz == 4) {
        nva_wr32(regspace->cnum,0x1c17c8,addr);
        nva_wr32(regspace->cnum,0x1c17cc,uVar3);
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_VCOMP_REG:
    if ((regspace->card->chipset).chipset == 0xaf) {
      if (regspace->regsz == 8) {
        nva_wr32(regspace->cnum,0x1c17d0,addr >> 3);
        nva_wr32(regspace->cnum,0x1c17d4,uVar3);
        nva_wr32(regspace->cnum,0x1c17d8,(uint32_t)(val >> 0x20));
        regspace_local._4_4_ = 0;
      }
      else {
        regspace_local._4_4_ = 2;
      }
    }
    else {
      regspace_local._4_4_ = 3;
    }
    break;
  case NVA_REGSPACE_MACRO_CODE:
    if ((regspace->card->chipset).chipset < 0xc0) {
      regspace_local._4_4_ = 3;
    }
    else if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x40986c,0x10);
      nva_wr32(regspace->cnum,0x409ffc,2);
      nva_wr32(regspace->cnum,0x409928,0xc);
      do {
        uVar2 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar2 != 0);
      nva_wr32(regspace->cnum,0x40993c,0xf);
      nva_wr32(regspace->cnum,0x409928,10);
      do {
        uVar2 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar2 != 0);
      nva_wr32(regspace->cnum,0x40991c,1);
      nva_wr32(regspace->cnum,0x409928,1);
      do {
        uVar2 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar2 != 0);
      for (vgabase = 0; vgabase < addr; vgabase = vgabase + 4) {
        nva_wr32(regspace->cnum,0x409928,6);
        do {
          uVar2 = nva_rd32(regspace->cnum,0x409928);
        } while (uVar2 != 0);
      }
      nva_wr32(regspace->cnum,0x409918,uVar3);
      nva_wr32(regspace->cnum,0x409928,7);
      do {
        uVar3 = nva_rd32(regspace->cnum,0x409928);
      } while (uVar3 != 0);
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  case NVA_REGSPACE_XT:
    if (regspace->regsz == 4) {
      nva_wr32(regspace->cnum,0x1700,0x30);
      nva_wr32(regspace->cnum,0x700004,addr);
      nva_wr32(regspace->cnum,0x700008,uVar3);
      nva_wr32(regspace->cnum,0x70000,1);
      do {
        uVar3 = nva_rd32(regspace->cnum,0x70000);
      } while (uVar3 != 0);
      nva_wr32(regspace->cnum,0x700000,2);
      do {
        uVar3 = nva_rd32(regspace->cnum,0x700000);
      } while (uVar3 != 0);
      regspace_local._4_4_ = 0;
    }
    else {
      regspace_local._4_4_ = 2;
    }
    break;
  default:
    regspace_local._4_4_ = 3;
  }
  return regspace_local._4_4_;
}

Assistant:

int nva_wr(struct nva_regspace *regspace, uint32_t addr, uint64_t val) {
	void *rawbase = 0;
	size_t rawlen;
	void *raw;
	int i;
	uint32_t vgaio;
	uint32_t vgabase;
	switch (regspace->type) {
		case NVA_REGSPACE_BAR0:
			rawbase = regspace->card->bar0;
			rawlen = regspace->card->bar0len;
			goto raw;
		case NVA_REGSPACE_BAR1:
			rawbase = regspace->card->bar1;
			rawlen = regspace->card->bar1len;
			if (!regspace->card->hasbar1)
				return NVA_ERR_NOSPC;
			goto raw;
		case NVA_REGSPACE_BAR2:
			rawbase = regspace->card->bar2;
			rawlen = regspace->card->bar2len;
			if (!regspace->card->hasbar2)
				return NVA_ERR_NOSPC;
			goto raw;
		case NVA_REGSPACE_RAWMEM:
			rawbase = regspace->card->rawmem;
			rawlen = 0x100000;
		raw:
			if (!rawbase)
				return NVA_ERR_MAP;
			if (addr > rawlen - regspace->regsz)
				return NVA_ERR_RANGE;
			raw = (uint8_t *)rawbase + addr;
			switch (regspace->regsz) {
				case 1:
					*(volatile uint8_t *)raw = val;
					return 0;
				case 2:
					*(volatile uint16_t *)raw = val;
					return 0;
				case 4:
					*(volatile uint32_t *)raw = val;
					return 0;
				case 8:
					*(volatile uint64_t *)raw = val;
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_IOBAR:
			if (!regspace->card->iobar)
				return NVA_ERR_NOSPC;
			if (addr > regspace->card->iobarlen - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					pci_io_write8(regspace->card->iobar, addr, val);
					return 0;
				case 2:
					pci_io_write16(regspace->card->iobar, addr, val);
					return 0;
				case 4:
					pci_io_write32(regspace->card->iobar, addr, val);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_RAWIO:
			if (!regspace->card->rawio)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					pci_io_write8(regspace->card->rawio, addr, val);
					return 0;
				case 2:
					pci_io_write16(regspace->card->rawio, addr, val);
					return 0;
				case 4:
					pci_io_write32(regspace->card->rawio, addr, val);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_PDAC:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			if (regspace->regsz > 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x609010, addr & 0xff);
			nva_wr32(regspace->cnum, 0x609014, addr >> 8);
			for (i = 0; i < regspace->regsz; i++)
				nva_wr32(regspace->cnum, 0x609018, (val >> i * 8) & 0xff);
			return 0;
		case NVA_REGSPACE_EEPROM:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (addr >= 0x80)
				return NVA_ERR_RANGE;
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			nva_wr32(regspace->cnum, 0x60a400, 0x1000000 | addr << 8 | (val & 0xff));
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			return 0;
		case NVA_REGSPACE_VGA_CR:
			vgaio = 0x3d4;
			if (addr >= 0x100)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_SR:
			vgaio = 0x3c4;
			if (addr >= 8)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_GR:
			vgaio = 0x3ce;
			if (addr >= 0x10)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_AR:
			vgaio = 0x3c0;
			if (addr >= 0x20)
				return NVA_ERR_RANGE;
			goto vga;
		vga:
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (regspace->card->chipset.card_type == 0x01) {
				vgabase = 0x6d0000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			} else if (regspace->card->chipset.card_type < 0x50) {
				if (vgaio == 0x3c4 || vgaio == 0x3ce)
					vgabase = 0x0c0000;
				else
					vgabase = 0x601000;
				if (regspace->idx > 2)
					return NVA_ERR_NOSPC;
				if ((regspace->card->chipset.chipset < 0x17 || regspace->card->chipset.chipset == 0x1a || regspace->card->chipset.chipset == 0x20) && regspace->idx == 1)
					return NVA_ERR_NOSPC;
				vgabase += regspace->idx * 0x2000;
			} else {
				vgabase = 0x601000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			}
			if (vgaio == 0x3c0) {
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + 0x3c0);
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, addr);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, val);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, idx);
			} else {
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + vgaio);
				nva_wr8(regspace->cnum, vgabase + vgaio, addr);
				nva_wr8(regspace->cnum, vgabase + vgaio + 1, val);
				nva_wr8(regspace->cnum, vgabase + vgaio, idx);
			}
			return 0;
		case NVA_REGSPACE_VGA_ST:
			if (regspace->card->chipset.chipset < 0x41)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			uint32_t vstbase = 0x1380;
			if (regspace->card->chipset.card_type >= 0x50)
				vstbase = 0x619e40;
			uint32_t savepos = nva_rd32(regspace->cnum, vstbase+0xc);
			uint32_t savecfg = nva_rd32(regspace->cnum, vstbase+0x8);
			nva_wr32(regspace->cnum, vstbase+0xc, addr);
			nva_wr32(regspace->cnum, vstbase+0x8, 7);
			nva_wr32(regspace->cnum, vstbase+0x0, val);
			nva_wr32(regspace->cnum, vstbase+0x8, savecfg);
			nva_wr32(regspace->cnum, vstbase+0xc, savepos);
			return 0;
		case NVA_REGSPACE_DPRAM:
			if (regspace->card->chipset.chipset == 0x34) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400bb0, addr);
				nva_wr32(regspace->cnum, 0x400bb4, val);
				return 0;
			}
			if (regspace->card->chipset.card_type < 4 || regspace->card->chipset.card_type >= 0x20)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400828, addr);
			nva_wr32(regspace->cnum, 0x40082c, val);
			return 0;
		case NVA_REGSPACE_PIPE:
			if (regspace->card->chipset.card_type < 0x10 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400f50, addr);
			nva_wr32(regspace->cnum, 0x400f54, val);
			return 0;
		case NVA_REGSPACE_RDI:
			if (regspace->card->chipset.chipset == 0x17 || regspace->card->chipset.chipset == 0x18 || regspace->card->chipset.chipset == 0x1f) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400a08, addr);
				nva_wr32(regspace->cnum, 0x400a0c, val);
				return 0;
			}
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			nva_wr32(regspace->cnum, 0x400750, addr);
			nva_wr32(regspace->cnum, 0x400754, val);
			return 0;
		case NVA_REGSPACE_RDIB:
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			nva_wr32(regspace->cnum, 0x400750, addr);
			nva_wr32(regspace->cnum, 0x400758, val);
			return 0;
		case NVA_REGSPACE_VCOMP_CODE:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17c8, addr);
			nva_wr32(regspace->cnum, 0x1c17cc, val);
			return 0;
		case NVA_REGSPACE_VCOMP_REG:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17d0, addr/8);
			nva_wr32(regspace->cnum, 0x1c17d4, val);
			nva_wr32(regspace->cnum, 0x1c17d8, val >> 32);
			return 0;
		case NVA_REGSPACE_MACRO_CODE:
			if (regspace->card->chipset.chipset < 0xc0)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x40986c, 0x10);
			nva_wr32(regspace->cnum, 0x409ffc, 2);
			nva_wr32(regspace->cnum, 0x409928, 0xc);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40993c, 0xf);
			nva_wr32(regspace->cnum, 0x409928, 0xa);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40991c, 0x1);
			nva_wr32(regspace->cnum, 0x409928, 0x1);
			while (nva_rd32(regspace->cnum, 0x409928));
			for (i = 0; i < addr; i+=4) {
				nva_wr32(regspace->cnum, 0x409928, 0x6);
				while (nva_rd32(regspace->cnum, 0x409928));
			}
			nva_wr32(regspace->cnum, 0x409918, val);
			nva_wr32(regspace->cnum, 0x409928, 0x7);
			while (nva_rd32(regspace->cnum, 0x409928));
			return 0;
		case NVA_REGSPACE_XT:
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1700, 0x30);
			nva_wr32(regspace->cnum, 0x700004, addr);
			nva_wr32(regspace->cnum, 0x700008, val);
			nva_wr32(regspace->cnum, 0x70000, 1);
			while (nva_rd32(regspace->cnum, 0x70000));
			nva_wr32(regspace->cnum, 0x700000, 2);
			while (nva_rd32(regspace->cnum, 0x700000));
			return 0;
		default:
			return NVA_ERR_NOSPC;
	}
}